

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::redistribute_bits
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_ref t,size_t begin,size_t end,
          size_t count)

{
  long lVar1;
  value_type vVar2;
  size_t *psVar3;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this_00;
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  item_reference iVar4;
  size_t in_stack_00000008;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  *in_stack_00000010;
  size_t in_stack_00000018;
  subtree_ref_base<false> *in_stack_00000020;
  range_reference<bv::internal::bitview<std::vector>_> *in_stack_00000028;
  size_t childsize;
  size_t minsize;
  size_t k;
  leaf_reference leaf_1;
  size_t n;
  size_t i_1;
  size_t p_1;
  leaf_reference leaf;
  size_t step;
  size_t p;
  size_t i;
  bitview<std::vector> bits;
  size_t rem;
  size_t bits_per_leaf;
  size_t b;
  size_t in_stack_fffffffffffffd50;
  size_t in_stack_fffffffffffffd58;
  subtree_ref_base<false> *in_stack_fffffffffffffd60;
  range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>
  *in_stack_fffffffffffffd68;
  range_reference<bv::internal::bitview<std::vector>_> *ref;
  range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>
  *in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  bitview<std::vector> *in_stack_fffffffffffffd80;
  subtree_ref_base<false> *in_stack_fffffffffffffda0;
  subtree_ref_base<false> local_230;
  size_t local_208;
  ulong local_200;
  ulong local_1f8;
  size_t in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_stack_fffffffffffffe60;
  subtree_ref_base<false> in_stack_fffffffffffffe70;
  leaf_reference in_stack_fffffffffffffe98;
  ulong local_150;
  ulong local_148;
  subtree_ref_base<false> local_b0;
  size_t local_88;
  item_reference local_70;
  long local_60;
  ulong local_58;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  local_28 = in_RDX - in_RSI;
  local_30 = in_RCX / local_28;
  local_38 = in_RCX % local_28;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bitview<std::vector>::bitview<unsigned_long,void>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  local_60 = 0;
  for (local_58 = local_10; local_58 < local_18; local_58 = local_58 + 1) {
    iVar4 = subtree_ref_base<false>::pointers(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    local_70 = iVar4;
    vVar2 = item_reference::operator_cast_to_unsigned_long
                      ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                        *)0x15ddb0);
    if (vVar2 != 0) {
      subtree_ref_base<false>::child
                ((subtree_ref_base<false> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      psVar3 = subtree_ref_base<false>::size(&local_b0);
      local_88 = *psVar3;
      subtree_ref_base<false>::child
                ((subtree_ref_base<false> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      in_stack_fffffffffffffda0 =
           (subtree_ref_base<false> *)
           subtree_ref_base<false>::leaf((subtree_ref_base<false> *)0x15de23);
      bitview<bv::internal::bitarray_t<4096UL>::array>::size
                ((bitview<bv::internal::bitarray_t<4096UL>::array> *)0x15de3d);
      bitview<bv::internal::bitarray_t<4096UL>::array>::operator()
                ((bitview<bv::internal::bitarray_t<4096UL>::array> *)in_stack_fffffffffffffd60,
                 in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      bitview<std::vector>::operator()
                ((bitview<std::vector> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 in_stack_fffffffffffffd50);
      range_reference<bv::internal::bitview<std::vector>>::operator=
                ((range_reference<bv::internal::bitview<std::vector>_> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
      local_60 = local_88 + local_60;
    }
  }
  clear_children_counters
            (in_stack_fffffffffffffe60,(subtree_ref)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  ref = in_stack_00000028;
  for (local_148 = local_10; local_148 < local_18; local_148 = local_148 + 1) {
    local_150 = local_30;
    if (local_38 != 0) {
      local_150 = local_30 + 1;
      local_38 = local_38 - 1;
    }
    iVar4 = subtree_ref_base<false>::pointers(in_stack_00000020,in_stack_00000018);
    this_00 = iVar4._v;
    vVar2 = item_reference::operator_cast_to_unsigned_long
                      ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                        *)0x15e00d);
    if (vVar2 == 0) {
      subtree_ref::insert_child((subtree_ref *)this_00,(size_t)in_stack_fffffffffffffe98);
    }
    subtree_ref_base<false>::child
              ((subtree_ref_base<false> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe98 = subtree_ref_base<false>::leaf((subtree_ref_base<false> *)0x15e05e);
    bitview<bv::internal::bitarray_t<4096UL>::array>::clear
              ((bitview<bv::internal::bitarray_t<4096UL>::array> *)in_stack_00000020);
    bitview<std::vector>::operator()
              ((bitview<std::vector> *)in_stack_00000020,in_stack_00000018,(size_t)in_stack_00000010
              );
    bitview<bv::internal::bitarray_t<4096UL>::array>::size
              ((bitview<bv::internal::bitarray_t<4096UL>::array> *)0x15e0b4);
    bitview<bv::internal::bitarray_t<4096UL>::array>::operator()
              ((bitview<bv::internal::bitarray_t<4096UL>::array> *)in_stack_00000020,
               in_stack_00000018,(size_t)in_stack_00000010);
    range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096ul>::array>>::operator=
              (in_stack_fffffffffffffd70,ref);
    subtree_ref_base<false>::sizes(in_stack_fffffffffffffda0,(size_t)iVar4._v,iVar4._index);
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
    ::operator+=(in_stack_00000010,in_stack_00000008);
    in_stack_fffffffffffffd70 =
         (range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_> *)
         bitview<bv::internal::bitarray_t<4096UL>::array>::popcount
                   ((bitview<bv::internal::bitarray_t<4096UL>::array> *)in_stack_00000010);
    subtree_ref_base<false>::ranks(in_stack_fffffffffffffda0,(size_t)iVar4._v,iVar4._index);
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096ul,(bv::allocation_policy_t)0>::data_container>>
    ::operator+=(in_stack_00000010,in_stack_00000008);
    local_20 = local_20 - local_150;
  }
  if ((ulong)(*(long *)(in_RDI + 0x28) * (0x1000 - *(long *)(in_RDI + 0x28))) <=
      *(ulong *)(in_RDI + 0x40)) {
    for (local_1f8 = local_10; local_1f8 < local_18; local_1f8 = local_1f8 + 1) {
      lVar1 = *(long *)(in_RDI + 0x28);
      local_200 = (ulong)(lVar1 * (0x1000 - lVar1)) / (lVar1 + 1U);
      subtree_ref_base<false>::child
                ((subtree_ref_base<false> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      psVar3 = subtree_ref_base<false>::size(&local_230);
      local_208 = *psVar3;
      unused<unsigned_long&,unsigned_long&>(&local_200,&local_208);
    }
  }
  bitview<std::vector>::~bitview((bitview<std::vector> *)0x15e2b3);
  return;
}

Assistant:

void bt_impl<W, AP>::redistribute_bits(subtree_ref t,
                                               size_t begin, size_t end,
                                               size_t count)
        {
            size_t b = end - begin; // Number of children to use
            size_t bits_per_leaf = count / b; // Average number of bits per leaf
            size_t rem           = count % b; // Remainder
            
            assert(b == buffer || b == buffer + 1);
            
            // Here we use the existing abstraction of packed_view
            // to accumulate all the bits into a temporary buffer, and
            // subsequently redistribute them to the leaves
            bitview<std::vector> bits(count);
            
            for(size_t i = begin, p = 0; i < end; ++i) {
                if(t.pointers(i) != 0) {
                    size_t step = t.child(i).size();
                    leaf_reference leaf = t.child(i).leaf();
                    bits(p, p + step) = leaf(0, leaf.size());
                    p += step;
                }
            }
            
            clear_children_counters(t, begin, end);
            
            // The redistribution begins.
            for(size_t p = 0, i = begin; i < end; ++i)
            {
                // The remainder is evenly distributed between the first leaves
                size_t n = bits_per_leaf;
                if(rem) {
                    n += 1;
                    rem -= 1;
                }
                
                // Here we take into account the first steps, when
                // we have an empty root to fill up. If we're going to use
                // a children that doesn't exist, we create it.
                //FIXME: remove insert_child() like in redistribute_keys?
                if(t.pointers(i) == 0)
                    t.insert_child(i);
                
                // Take the bits out of the buffer, put them back into the leaf
                leaf_reference leaf = t.child(i).leaf();
                leaf.clear();
                leaf(0, leaf.size()) = bits(p, p + n);
                
                // Increment the counters
                t.sizes(i, degree) += n;
                t.ranks(i, degree) += leaf.popcount();
                
                // Count of the copied bits
                p += n;
                count -= n;
            }
            
            assert(count == 0);
            // This is debug code
            // It's important to stay in shape and not get too fat
            if(size >= (buffer * (leaf_bits - buffer))) {
                for(size_t k = begin; k < end; ++k) {
                    size_t minsize = (buffer *
                                      (leaf_bits - buffer)) /
                                     (buffer + 1);
                    size_t childsize = t.child(k).size();
                    assert(childsize >= minsize);
                    unused(minsize, childsize);
                }
            }
        }